

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version.cc
# Opt level: O0

bool ver_is_valid_magic(filemgr_magic_t magic)

{
  filemgr_magic_t magic_local;
  undefined1 local_1;
  
  if ((magic == 0xdeadcafebeefbeef) ||
     ((0xdeadcafebeefc000 < magic && (magic < 0xdeadcafebeefc003)))) {
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ver_is_valid_magic(filemgr_magic_t magic)
{
    if ( magic == FILEMGR_MAGIC_000 ||
        (magic >= FILEMGR_MAGIC_001 && magic <= FILEMGR_LATEST_MAGIC)) {
        return true;
    }
    return false;
}